

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,char **args)

{
  accessor<pybind11::detail::accessor_policies::str_attr> *this_00;
  char **in_RDX;
  PyObject local_28;
  char **args_local;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *this_local
  ;
  
  args_local = args;
  this_local = (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
                *)this;
  collect_arguments<(pybind11::return_value_policy)1,char_const*const&,void>
            ((detail *)&local_28,in_RDX);
  this_00 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::
            derived((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
                     *)args);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_28);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_28);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}